

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
* __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::find(basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
       *__return_storage_ptr__,
      arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      *this,basic_string_view<char> name)

{
  longlong *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  entry *peVar4;
  longlong lVar5;
  size_t sVar6;
  undefined8 uVar7;
  bool bVar8;
  entry *peVar9;
  long lVar10;
  
  peVar4 = this->map_;
  uVar3 = this->size_;
  lVar10 = 0;
  peVar9 = peVar4;
  while( true ) {
    if ((ulong)uVar3 * 0x30 - lVar10 == 0) {
      (__return_storage_ptr__->value_).field_0.int_value = 0;
      __return_storage_ptr__->type_ = none_type;
      return __return_storage_ptr__;
    }
    bVar8 = operator==(peVar9->name,name);
    if (bVar8) break;
    peVar9 = peVar9 + 1;
    lVar10 = lVar10 + 0x30;
  }
  plVar1 = (longlong *)((long)&(peVar4->arg).value_.field_0 + lVar10);
  lVar5 = *plVar1;
  sVar6 = plVar1[1];
  puVar2 = (undefined8 *)((long)&(peVar4->arg).type_ + lVar10);
  uVar7 = puVar2[1];
  *(undefined8 *)&__return_storage_ptr__->type_ = *puVar2;
  *(undefined8 *)&__return_storage_ptr__->field_0x18 = uVar7;
  (__return_storage_ptr__->value_).field_0.long_long_value = lVar5;
  (__return_storage_ptr__->value_).field_0.string.size = sVar6;
  return __return_storage_ptr__;
}

Assistant:

basic_format_arg<Context> find(basic_string_view<char_type> name) const {
    // The list is unsorted, so just return the first matching name.
    for (entry *it = map_, *end = map_ + size_; it != end; ++it) {
      if (it->name == name)
        return it->arg;
    }
    return basic_format_arg<Context>();
  }